

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printf.h
# Opt level: O0

void __thiscall
fmt::v5::
basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>
::format(basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>
         *this)

{
  iterator it_00;
  iterator it_01;
  null_terminating_iterator<char> it_02;
  null_terminating_iterator<char> it_03;
  null_terminating_iterator<char> it_04;
  null_terminating_iterator<char> it_05;
  null_terminating_iterator<char> it_06;
  null_terminating_iterator<char> it_07;
  char cVar1;
  bool bVar2;
  type tVar3;
  type tVar4;
  undefined8 uVar5;
  context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
  *in_RDI;
  format_arg arg;
  error_handler eh;
  uint arg_index;
  format_specs spec;
  char_type c;
  iterator it;
  iterator start;
  basic_buffer<char> *buffer;
  basic_parse_context<char,_fmt::v5::internal::error_handler> *in_stack_fffffffffffffda8;
  back_insert_iterator<fmt::v5::internal::basic_buffer<char>_> in_stack_fffffffffffffdb0;
  uint in_stack_fffffffffffffdbc;
  basic_format_arg<fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>_>
  *in_stack_fffffffffffffdc0;
  context_type *in_stack_fffffffffffffdc8;
  uint in_stack_fffffffffffffdd0;
  uint in_stack_fffffffffffffdd4;
  basic_buffer<char> *in_stack_fffffffffffffdd8;
  basic_buffer<char> *in_stack_fffffffffffffde0;
  error_handler *in_stack_fffffffffffffdf0;
  basic_format_arg<fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>_>
  *in_stack_fffffffffffffe00;
  printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>
  *in_stack_fffffffffffffe08;
  char_converter<fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>_>
  *in_stack_fffffffffffffe10;
  format_specs *in_stack_fffffffffffffe28;
  iterator *in_stack_fffffffffffffe30;
  basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>
  *in_stack_fffffffffffffe38;
  char_converter<fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>_>
  local_1b8;
  null_terminating_iterator<char> local_1b0 [2];
  null_terminating_iterator<char> local_190;
  null_terminating_iterator<char> local_180;
  null_terminating_iterator<char> local_170;
  null_terminating_iterator<char> local_160;
  char *local_148;
  char *local_140;
  basic_format_arg<fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>_>
  local_138;
  char *local_118;
  char *local_110;
  null_terminating_iterator<char> local_e0;
  error_handler local_c9;
  null_terminating_iterator<char> local_c8;
  uint local_b8;
  int local_b0;
  undefined4 local_ac;
  core_format_specs local_a8;
  char *local_a0;
  char *local_98;
  char *local_90;
  char *local_88;
  null_terminating_iterator<char> local_80;
  char *local_70;
  char *local_68;
  char *local_60;
  char *local_58;
  null_terminating_iterator<char> local_50;
  char local_39;
  null_terminating_iterator<char> local_38;
  char *local_28;
  char *local_20;
  basic_buffer<char> *local_18;
  basic_buffer<char> *local_10;
  
  local_18 = (basic_buffer<char> *)
             internal::
             context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
             ::out(in_RDI);
  local_10 = internal::get_container<fmt::v5::internal::basic_buffer<char>>
                       (in_stack_fffffffffffffdb0);
  internal::
  context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>,_char>
  ::parse_context(in_RDI);
  internal::null_terminating_iterator<char>::
  null_terminating_iterator<fmt::v5::basic_parse_context<char,fmt::v5::internal::error_handler>>
            ((null_terminating_iterator<char> *)in_stack_fffffffffffffdb0.container,
             in_stack_fffffffffffffda8);
  local_38.ptr_ = local_28;
  local_38.end_ = local_20;
  while( true ) {
    while( true ) {
      do {
        cVar1 = internal::null_terminating_iterator<char>::operator*(&local_38);
        if (cVar1 == '\0') {
          it_03.end_ = local_20;
          it_03.ptr_ = local_28;
          internal::pointer_from<char>(it_03);
          it_02.end_ = local_38.end_;
          it_02.ptr_ = local_38.ptr_;
          internal::pointer_from<char>(it_02);
          internal::basic_buffer<char>::append<char>
                    (in_stack_fffffffffffffde0,(char *)in_stack_fffffffffffffdd8,
                     (char *)CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0));
          return;
        }
        local_50 = internal::null_terminating_iterator<char>::operator++(&local_38,0);
        local_39 = internal::null_terminating_iterator<char>::operator*(&local_50);
      } while (local_39 != '%');
      cVar1 = internal::null_terminating_iterator<char>::operator*(&local_38);
      if (cVar1 != local_39) break;
      local_60 = local_28;
      local_58 = local_20;
      it_07.end_ = local_20;
      it_07.ptr_ = local_28;
      in_stack_fffffffffffffdf0 = (error_handler *)internal::pointer_from<char>(it_07);
      local_70 = local_38.ptr_;
      local_68 = local_38.end_;
      it_06.end_ = local_38.end_;
      it_06.ptr_ = local_38.ptr_;
      internal::pointer_from<char>(it_06);
      internal::basic_buffer<char>::append<char>
                (in_stack_fffffffffffffde0,(char *)in_stack_fffffffffffffdd8,
                 (char *)CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0));
      local_80 = internal::null_terminating_iterator<char>::operator++(&local_38);
      local_28 = local_80.ptr_;
      local_20 = local_80.end_;
    }
    local_90 = local_28;
    local_88 = local_20;
    it_05.end_ = local_20;
    it_05.ptr_ = local_28;
    in_stack_fffffffffffffdd8 = local_10;
    in_stack_fffffffffffffde0 = (basic_buffer<char> *)internal::pointer_from<char>(it_05);
    local_a0 = local_38.ptr_;
    local_98 = local_38.end_;
    it_04.end_ = local_38.end_;
    it_04.ptr_ = local_38.ptr_;
    internal::pointer_from<char>(it_04);
    internal::basic_buffer<char>::append<char>
              (in_stack_fffffffffffffde0,(char *)in_stack_fffffffffffffdd8,
               (char *)CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0));
    basic_format_specs<char>::basic_format_specs
              ((basic_format_specs<char> *)in_stack_fffffffffffffdb0.container);
    local_ac = 2;
    local_b8 = parse_header(in_stack_fffffffffffffe38,in_stack_fffffffffffffe30,
                            in_stack_fffffffffffffe28);
    cVar1 = internal::null_terminating_iterator<char>::operator*(&local_38);
    if (cVar1 == '.') {
      local_c8 = internal::null_terminating_iterator<char>::operator++(&local_38);
      cVar1 = internal::null_terminating_iterator<char>::operator*(&local_38);
      if ((cVar1 < '0') ||
         (cVar1 = internal::null_terminating_iterator<char>::operator*(&local_38), '9' < cVar1)) {
        cVar1 = internal::null_terminating_iterator<char>::operator*(&local_38);
        if (cVar1 == '*') {
          local_e0 = internal::null_terminating_iterator<char>::operator++(&local_38);
          local_118 = local_38.ptr_;
          local_110 = local_38.end_;
          std::numeric_limits<unsigned_int>::max();
          it_00.end_._0_4_ = in_stack_fffffffffffffdd0;
          it_00.ptr_ = (char *)in_stack_fffffffffffffdc8;
          it_00.end_._4_4_ = in_stack_fffffffffffffdd4;
          get_arg((basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>
                   *)in_stack_fffffffffffffdc0,it_00,in_stack_fffffffffffffdbc);
          local_a8.precision =
               visit_format_arg<fmt::v5::internal::printf_precision_handler,fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char,fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>>>
                         ((printf_precision_handler *)in_stack_fffffffffffffe08,
                          in_stack_fffffffffffffe00);
        }
        else {
          local_a8.precision = 0;
        }
      }
      else {
        internal::error_handler::error_handler(&local_c9);
        local_a8.precision =
             internal::
             parse_nonnegative_int<fmt::v5::internal::null_terminating_iterator<char>,fmt::v5::internal::error_handler&>
                       ((null_terminating_iterator<char> *)in_RDI,in_stack_fffffffffffffdf0);
      }
    }
    local_148 = local_38.ptr_;
    local_140 = local_38.end_;
    it_01.end_._0_4_ = in_stack_fffffffffffffdd0;
    it_01.ptr_ = (char *)in_stack_fffffffffffffdc8;
    it_01.end_._4_4_ = in_stack_fffffffffffffdd4;
    get_arg((basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>
             *)in_stack_fffffffffffffdc0,it_01,in_stack_fffffffffffffdbc);
    bVar2 = core_format_specs::has(&local_a8,8);
    in_stack_fffffffffffffdd4 = in_stack_fffffffffffffdd4 & 0xffffff;
    if (bVar2) {
      tVar3 = visit_format_arg<fmt::v5::internal::is_zero_int,fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char,fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>>>
                        ((is_zero_int *)in_stack_fffffffffffffe08,in_stack_fffffffffffffe00);
      in_stack_fffffffffffffdd4 = CONCAT13(tVar3,(int3)in_stack_fffffffffffffdd4);
    }
    if ((char)(in_stack_fffffffffffffdd4 >> 0x18) != '\0') {
      in_stack_fffffffffffffdd0 = (uint)local_a8.flags;
      tVar4 = internal::to_unsigned<int>(8);
      local_a8.flags = (byte)in_stack_fffffffffffffdd0 & ((byte)tVar4 ^ 0xff);
    }
    if (local_b0 == 0x30) {
      bVar2 = basic_format_arg<fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>_>
              ::is_arithmetic((basic_format_arg<fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>_>
                               *)0x14433a);
      if (bVar2) {
        local_ac = 4;
      }
      else {
        local_b0 = 0x20;
      }
    }
    local_160 = internal::null_terminating_iterator<char>::operator++(&local_38,0);
    cVar1 = internal::null_terminating_iterator<char>::operator*(&local_160);
    in_stack_fffffffffffffdc8 = (context_type *)(ulong)((int)cVar1 - 0x4c);
    switch(in_stack_fffffffffffffdc8) {
    case (context_type *)0x0:
      break;
    default:
      local_190 = internal::null_terminating_iterator<char>::operator--(&local_38);
      internal::null_terminating_iterator<char>::operator*(&local_38);
      internal::
      convert_arg<void,fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char,fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>>,char>
                (in_stack_fffffffffffffdc0,(char)(in_stack_fffffffffffffdbc >> 0x18));
      break;
    case (context_type *)0x1c:
      cVar1 = internal::null_terminating_iterator<char>::operator*(&local_38);
      if (cVar1 == 'h') {
        local_170 = internal::null_terminating_iterator<char>::operator++(&local_38);
        internal::null_terminating_iterator<char>::operator*(&local_170);
        internal::
        convert_arg<signed_char,fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char,fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>>,char>
                  (in_stack_fffffffffffffdc0,(char)(in_stack_fffffffffffffdbc >> 0x18));
      }
      else {
        internal::null_terminating_iterator<char>::operator*(&local_38);
        internal::
        convert_arg<short,fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char,fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>>,char>
                  (in_stack_fffffffffffffdc0,(char)(in_stack_fffffffffffffdbc >> 0x18));
      }
      break;
    case (context_type *)0x1e:
      internal::null_terminating_iterator<char>::operator*(&local_38);
      internal::
      convert_arg<long,fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char,fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>>,char>
                (in_stack_fffffffffffffdc0,(char)(in_stack_fffffffffffffdbc >> 0x18));
      break;
    case (context_type *)0x20:
      cVar1 = internal::null_terminating_iterator<char>::operator*(&local_38);
      if (cVar1 == 'l') {
        local_180 = internal::null_terminating_iterator<char>::operator++(&local_38);
        internal::null_terminating_iterator<char>::operator*(&local_180);
        internal::
        convert_arg<long_long,fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char,fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>>,char>
                  (in_stack_fffffffffffffdc0,(char)(in_stack_fffffffffffffdbc >> 0x18));
      }
      else {
        internal::null_terminating_iterator<char>::operator*(&local_38);
        internal::
        convert_arg<long,fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char,fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>>,char>
                  (in_stack_fffffffffffffdc0,(char)(in_stack_fffffffffffffdbc >> 0x18));
      }
      break;
    case (context_type *)0x28:
      internal::null_terminating_iterator<char>::operator*(&local_38);
      internal::
      convert_arg<long,fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char,fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>>,char>
                (in_stack_fffffffffffffdc0,(char)(in_stack_fffffffffffffdbc >> 0x18));
      break;
    case (context_type *)0x2e:
      internal::null_terminating_iterator<char>::operator*(&local_38);
      internal::
      convert_arg<unsigned_long,fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char,fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>>,char>
                (in_stack_fffffffffffffdc0,(char)(in_stack_fffffffffffffdbc >> 0x18));
    }
    cVar1 = internal::null_terminating_iterator<char>::operator*(&local_38);
    if (cVar1 == '\0') break;
    local_1b0[0] = internal::null_terminating_iterator<char>::operator++(&local_38,0);
    local_a8.type = internal::null_terminating_iterator<char>::operator*(local_1b0);
    bVar2 = basic_format_arg<fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>_>
            ::is_integral((basic_format_arg<fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>_>
                           *)0x1445df);
    if (bVar2) {
      in_stack_fffffffffffffdbc = (uint)local_a8.type;
      if (in_stack_fffffffffffffdbc == 99) {
        internal::
        char_converter<fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>_>
        ::char_converter(&local_1b8,&local_138);
        visit_format_arg<fmt::v5::internal::char_converter<fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char,fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>>>,fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char,fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>>>
                  (in_stack_fffffffffffffe10,
                   (basic_format_arg<fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>_>
                    *)in_stack_fffffffffffffe08);
      }
      else if ((in_stack_fffffffffffffdbc == 0x69) || (in_stack_fffffffffffffdbc == 0x75)) {
        local_a8.type = 'd';
      }
    }
    local_28 = local_38.ptr_;
    local_20 = local_38.end_;
    printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>::
    printf_arg_formatter
              ((printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>
                *)in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8,
               (format_specs *)CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0),
               in_stack_fffffffffffffdc8);
    visit_format_arg<fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char,fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>>>
              (in_stack_fffffffffffffe08,in_stack_fffffffffffffe00);
  }
  uVar5 = __cxa_allocate_exception(0x10);
  format_error::format_error
            ((format_error *)in_stack_fffffffffffffdb0.container,(char *)in_stack_fffffffffffffda8);
  __cxa_throw(uVar5,&format_error::typeinfo,format_error::~format_error);
}

Assistant:

void basic_printf_context<OutputIt, Char, AF>::format() {
  auto &buffer = internal::get_container(this->out());
  auto start = iterator(this->parse_context());
  auto it = start;
  using internal::pointer_from;
  while (*it) {
    char_type c = *it++;
    if (c != '%') continue;
    if (*it == c) {
      buffer.append(pointer_from(start), pointer_from(it));
      start = ++it;
      continue;
    }
    buffer.append(pointer_from(start), pointer_from(it) - 1);

    format_specs spec;
    spec.align_ = ALIGN_RIGHT;

    // Parse argument index, flags and width.
    unsigned arg_index = parse_header(it, spec);

    // Parse precision.
    if (*it == '.') {
      ++it;
      if ('0' <= *it && *it <= '9') {
        internal::error_handler eh;
        spec.precision = static_cast<int>(parse_nonnegative_int(it, eh));
      } else if (*it == '*') {
        ++it;
        spec.precision =
            visit_format_arg(internal::printf_precision_handler(), get_arg(it));
      } else {
        spec.precision = 0;
      }
    }

    format_arg arg = get_arg(it, arg_index);
    if (spec.has(HASH_FLAG) && visit_format_arg(internal::is_zero_int(), arg))
      spec.flags = static_cast<uint_least8_t>(spec.flags & (~internal::to_unsigned<int>(HASH_FLAG)));
    if (spec.fill_ == '0') {
      if (arg.is_arithmetic())
        spec.align_ = ALIGN_NUMERIC;
      else
        spec.fill_ = ' ';  // Ignore '0' flag for non-numeric types.
    }

    // Parse length and convert the argument to the required type.
    using internal::convert_arg;
    switch (*it++) {
    case 'h':
      if (*it == 'h')
        convert_arg<signed char>(arg, *++it);
      else
        convert_arg<short>(arg, *it);
      break;
    case 'l':
      if (*it == 'l')
        convert_arg<long long>(arg, *++it);
      else
        convert_arg<long>(arg, *it);
      break;
    case 'j':
      convert_arg<intmax_t>(arg, *it);
      break;
    case 'z':
      convert_arg<std::size_t>(arg, *it);
      break;
    case 't':
      convert_arg<std::ptrdiff_t>(arg, *it);
      break;
    case 'L':
      // printf produces garbage when 'L' is omitted for long double, no
      // need to do the same.
      break;
    default:
      --it;
      convert_arg<void>(arg, *it);
    }

    // Parse type.
    if (!*it)
      FMT_THROW(format_error("invalid format string"));
    spec.type = static_cast<char>(*it++);
    if (arg.is_integral()) {
      // Normalize type.
      switch (spec.type) {
      case 'i': case 'u':
        spec.type = 'd';
        break;
      case 'c':
        // TODO: handle wchar_t better?
        visit_format_arg(
              internal::char_converter<basic_printf_context>(arg), arg);
        break;
      }
    }

    start = it;

    // Format argument.
    visit_format_arg(AF(buffer, spec, *this), arg);
  }
  buffer.append(pointer_from(start), pointer_from(it));
}